

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyleCaches::objectDestroyed(QStyleSheetStyleCaches *this,QObject *o)

{
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  QHash<const_QObject_*,_QList<QCss::StyleRule>_>::remove
            ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)(in_RDI + 0x10),(char *)&local_10);
  QHash<const_QObject_*,_QHash<int,_bool>_>::remove
            ((QHash<const_QObject_*,_QHash<int,_bool>_> *)(in_RDI + 0x18),(char *)&local_10);
  QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>::remove
            ((QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_> *)
             (in_RDI + 0x20),(char *)&local_10);
  local_18 = local_10;
  QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::remove
            ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *)(in_RDI + 0x38),
             (char *)&local_18);
  local_20 = local_10;
  QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::remove
            ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)(in_RDI + 0x40),
             (char *)&local_20);
  local_28 = local_10;
  QHash<const_void_*,_QCss::StyleSheet>::remove
            ((QHash<const_void_*,_QCss::StyleSheet> *)(in_RDI + 0x28),(char *)&local_28);
  local_30 = local_10;
  QSet<const_QWidget_*>::remove((QSet<const_QWidget_*> *)(in_RDI + 0x30),(char *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyleCaches::objectDestroyed(QObject *o)
{
    styleRulesCache.remove(o);
    hasStyleRuleCache.remove(o);
    renderRulesCache.remove(o);
    customPaletteWidgets.remove((const QWidget *)o);
    customFontWidgets.remove(static_cast<QWidget *>(o));
    styleSheetCache.remove(o);
    autoFillDisabledWidgets.remove((const QWidget *)o);
}